

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initgamedialog.cpp
# Opt level: O1

void __thiscall InitGameDialog::InitGameDialog(InitGameDialog *this,QWidget *parent)

{
  void **ppvVar1;
  Ui_InitGameDialog *this_00;
  undefined4 *puVar2;
  QObject local_28 [8];
  code *local_20;
  undefined8 local_18;
  
  QDialog::QDialog(&this->super_QDialog,parent,0);
  *(undefined ***)this = &PTR_metaObject_0010f830;
  *(undefined ***)&this->field_0x10 = &PTR__InitGameDialog_0010fa08;
  this_00 = (Ui_InitGameDialog *)operator_new(0x40);
  this->ui = (InitGameDialog *)this_00;
  Ui_InitGameDialog::setupUi(this_00,&this->super_QDialog);
  ppvVar1 = *(void ***)(this->ui + 0x28);
  local_20 = QDialogButtonBox::accepted;
  local_18 = 0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sholmp[P]qt_tictactoe/initgamedialog.cpp:11:57),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(InitGameDialog **)(puVar2 + 4) = this;
  QObject::connectImpl
            (local_28,ppvVar1,(QObject *)&local_20,ppvVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar2,(int *)0x1,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  return;
}

Assistant:

InitGameDialog::InitGameDialog(QWidget *parent) :
    QDialog(parent),
    ui(new Ui::InitGameDialog)
{
    ui->setupUi(this);
//    ui->player1Label->setBuddy()
    connect(ui->buttonBox, &QDialogButtonBox::accepted, [this](){emit sendPlayerNames("foo", "bar");});

}